

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlOutputter.cpp
# Opt level: O0

void __thiscall CppUnit::XmlOutputter::addStatistics(XmlOutputter *this,XmlElement *rootNode)

{
  bool bVar1;
  int iVar2;
  XmlElement *pXVar3;
  XmlElement *pXVar4;
  reference ppXVar5;
  iterator local_160;
  undefined1 local_140 [8];
  iterator it;
  string local_118;
  undefined1 local_f2;
  allocator<char> local_f1;
  string local_f0;
  undefined1 local_ca;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a2;
  allocator<char> local_a1;
  string local_a0;
  undefined1 local_7a;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  XmlElement *local_20;
  XmlElement *statisticsElement;
  XmlElement *rootNode_local;
  XmlOutputter *this_local;
  
  statisticsElement = rootNode;
  rootNode_local = (XmlElement *)this;
  pXVar3 = (XmlElement *)operator_new(0xe8);
  local_7a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Statistics",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
  XmlElement::XmlElement(pXVar3,&local_40,&local_78);
  local_7a = 0;
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_20 = pXVar3;
  XmlElement::addElement(statisticsElement,pXVar3);
  pXVar3 = local_20;
  pXVar4 = (XmlElement *)operator_new(0xe8);
  local_a2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"Tests",&local_a1);
  iVar2 = (*(this->m_result->super_TestSuccessListener).super_TestListener._vptr_TestListener[0xb])
                    ();
  XmlElement::XmlElement(pXVar4,&local_a0,iVar2);
  local_a2 = 0;
  XmlElement::addElement(pXVar3,pXVar4);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  pXVar3 = local_20;
  pXVar4 = (XmlElement *)operator_new(0xe8);
  local_ca = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"FailuresTotal",&local_c9);
  iVar2 = (*(this->m_result->super_TestSuccessListener).super_TestListener._vptr_TestListener[0xe])
                    ();
  XmlElement::XmlElement(pXVar4,&local_c8,iVar2);
  local_ca = 0;
  XmlElement::addElement(pXVar3,pXVar4);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  pXVar3 = local_20;
  pXVar4 = (XmlElement *)operator_new(0xe8);
  local_f2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"Errors",&local_f1);
  iVar2 = (*(this->m_result->super_TestSuccessListener).super_TestListener._vptr_TestListener[0xc])
                    ();
  XmlElement::XmlElement(pXVar4,&local_f0,iVar2);
  local_f2 = 0;
  XmlElement::addElement(pXVar3,pXVar4);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  pXVar3 = local_20;
  pXVar4 = (XmlElement *)operator_new(0xe8);
  it._M_node._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"Failures",(allocator<char> *)((long)&it._M_node + 7));
  iVar2 = (*(this->m_result->super_TestSuccessListener).super_TestListener._vptr_TestListener[0xd])
                    ();
  XmlElement::XmlElement(pXVar4,&local_118,iVar2);
  it._M_node._6_1_ = 0;
  XmlElement::addElement(pXVar3,pXVar4);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
  std::deque<CppUnit::XmlOutputterHook_*,_std::allocator<CppUnit::XmlOutputterHook_*>_>::begin
            ((iterator *)local_140,&this->m_hooks);
  while( true ) {
    std::deque<CppUnit::XmlOutputterHook_*,_std::allocator<CppUnit::XmlOutputterHook_*>_>::end
              (&local_160,&this->m_hooks);
    bVar1 = std::operator!=((_Self *)local_140,&local_160);
    if (!bVar1) break;
    ppXVar5 = std::
              _Deque_iterator<CppUnit::XmlOutputterHook_*,_CppUnit::XmlOutputterHook_*&,_CppUnit::XmlOutputterHook_**>
              ::operator*((_Deque_iterator<CppUnit::XmlOutputterHook_*,_CppUnit::XmlOutputterHook_*&,_CppUnit::XmlOutputterHook_**>
                           *)local_140);
    (*(*ppXVar5)->_vptr_XmlOutputterHook[4])(*ppXVar5,this->m_xml,local_20);
    std::
    _Deque_iterator<CppUnit::XmlOutputterHook_*,_CppUnit::XmlOutputterHook_*&,_CppUnit::XmlOutputterHook_**>
    ::operator++((_Deque_iterator<CppUnit::XmlOutputterHook_*,_CppUnit::XmlOutputterHook_*&,_CppUnit::XmlOutputterHook_**>
                  *)local_140);
  }
  return;
}

Assistant:

void
XmlOutputter::addStatistics( XmlElement *rootNode )
{
  XmlElement *statisticsElement = new XmlElement( "Statistics" );
  rootNode->addElement( statisticsElement );
  statisticsElement->addElement( new XmlElement( "Tests", m_result->runTests() ) );
  statisticsElement->addElement( new XmlElement( "FailuresTotal", 
                                                 m_result->testFailuresTotal() ) );
  statisticsElement->addElement( new XmlElement( "Errors", m_result->testErrors() ) );
  statisticsElement->addElement( new XmlElement( "Failures", m_result->testFailures() ) );

  for ( Hooks::iterator it = m_hooks.begin(); it != m_hooks.end(); ++it )
    (*it)->statisticsAdded( m_xml, statisticsElement );
}